

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  Mat *this_00;
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  ulong uVar3;
  int _w;
  bool bVar4;
  Mat weight_data_int8;
  Mat weight_data_r2;
  Option opt_q;
  Mat local_158;
  Mat local_108;
  Mat local_b8;
  Option local_68;
  
  if ((((this->dynamic_weight == 0) && (opt->use_int8_inference == true)) &&
      ((this->weight_data).elemsize == 4)) && (this->int8_scale_term != 0)) {
    this_00 = &this->weight_data;
    _w = this->kernel_h * this->kernel_w;
    uVar3 = (long)this->weight_data_size / (long)this->num_output;
    Mat::reshape(&local_b8,this_00,_w,
                 (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                      (long)_w),this->num_output,(Allocator *)0x0);
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108._20_8_ = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    uVar3._0_1_ = opt->use_bf16_storage;
    uVar3._1_1_ = opt->use_fp16_packed;
    uVar3._2_1_ = opt->use_fp16_storage;
    uVar3._3_1_ = opt->use_fp16_arithmetic;
    uVar3._4_1_ = opt->use_int8_packed;
    uVar3._5_1_ = opt->use_int8_storage;
    uVar3._6_1_ = opt->use_int8_arithmetic;
    uVar3._7_1_ = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.use_reserved_3 = opt->use_reserved_3;
    local_68.use_reserved_4 = opt->use_reserved_4;
    local_68.use_reserved_5 = opt->use_reserved_5;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = (this->weight_data).allocator;
    local_68._32_8_ = uVar3 & 0xffffffffffffff;
    quantize_to_int8(&local_b8,&local_108,&this->weight_data_int8_scales,&local_68);
    if (local_108.data == (void *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = (long)local_108.c * local_108.cstep == 0;
    }
    if (!bVar4) {
      Mat::reshape(&local_158,&local_108,this->weight_data_size,(Allocator *)0x0);
      if (this_00 != &local_158) {
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            __ptr = (this->weight_data).data;
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
        this_00->data = (void *)0x0;
        (this->weight_data).refcount = (int *)0x0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).d = 0;
        (this->weight_data).c = 0;
        (this->weight_data).data = local_158.data;
        (this->weight_data).refcount = local_158.refcount;
        (this->weight_data).elemsize = local_158.elemsize;
        (this->weight_data).elempack = local_158.elempack;
        (this->weight_data).allocator = local_158.allocator;
        (this->weight_data).dims = local_158.dims;
        (this->weight_data).w = local_158.w;
        (this->weight_data).h = local_158.h;
        (this->weight_data).d = local_158.d;
        (this->weight_data).c = local_158.c;
        (this->weight_data).cstep = local_158.cstep;
      }
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (*local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_b8.refcount != (int *)0x0) {
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar4) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q = opt;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}